

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

int x509_get_certificate_policies(uchar **p,uchar *end,mbedtls_x509_sequence *certificate_policies)

{
  int *piVar1;
  uchar *puVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  mbedtls_x509_sequence *pmVar6;
  int iVar7;
  uchar *end_00;
  bool bVar8;
  size_t local_38;
  size_t len;
  
  iVar4 = mbedtls_asn1_get_tag(p,end,&local_38,0x30);
  if (iVar4 == 0) {
    iVar4 = -0x2566;
    if ((local_38 != 0) && (*p + local_38 == end)) {
      iVar7 = 0;
      do {
        if (end <= *p) {
          certificate_policies->next = (mbedtls_asn1_sequence *)0x0;
          if (*p != end) {
            return -0x2566;
          }
          return iVar7;
        }
        iVar5 = mbedtls_asn1_get_tag(p,end,&local_38,0x30);
        pmVar6 = certificate_policies;
        if (iVar5 == 0) {
          end_00 = *p + local_38;
          iVar5 = mbedtls_asn1_get_tag(p,end_00,&local_38,6);
          sVar3 = local_38;
          if (iVar5 == 0) {
            piVar1 = (int *)*p;
            iVar5 = -0x2080;
            if ((local_38 == 4) && (iVar5 = iVar7, *piVar1 != 0x201d55)) {
              iVar5 = -0x2080;
            }
            iVar7 = iVar5;
            if ((certificate_policies->buf).p == (uchar *)0x0) {
LAB_0021e9cc:
              (pmVar6->buf).tag = 6;
              (pmVar6->buf).p = (uchar *)piVar1;
              (pmVar6->buf).len = sVar3;
              puVar2 = *p;
              *p = puVar2 + sVar3;
              if (puVar2 + sVar3 < end_00) {
                iVar5 = mbedtls_asn1_get_tag(p,end_00,&local_38,0x30);
                if (iVar5 != 0) {
                  iVar4 = iVar5 + -0x2500;
                  bVar8 = false;
                  goto LAB_0021ea31;
                }
                *p = *p + local_38;
              }
              bVar8 = *p == end_00;
              if (!bVar8) {
                iVar4 = -0x2566;
              }
            }
            else {
              if (certificate_policies->next == (mbedtls_asn1_sequence *)0x0) {
                pmVar6 = (mbedtls_x509_sequence *)calloc(1,0x20);
                certificate_policies->next = pmVar6;
                if (pmVar6 != (mbedtls_x509_sequence *)0x0) goto LAB_0021e9cc;
                iVar4 = -0x256a;
              }
              else {
                iVar4 = -0x2500;
              }
              bVar8 = false;
              pmVar6 = certificate_policies;
            }
          }
          else {
            iVar4 = iVar5 + -0x2500;
            bVar8 = false;
          }
        }
        else {
          iVar4 = iVar5 + -0x2500;
          bVar8 = false;
        }
LAB_0021ea31:
        certificate_policies = pmVar6;
      } while (bVar8);
    }
  }
  else {
    iVar4 = iVar4 + -0x2500;
  }
  return iVar4;
}

Assistant:

static int x509_get_certificate_policies(unsigned char **p,
                                         const unsigned char *end,
                                         mbedtls_x509_sequence *certificate_policies)
{
    int ret, parse_ret = 0;
    size_t len;
    mbedtls_asn1_buf *buf;
    mbedtls_asn1_sequence *cur = certificate_policies;

    /* Get main sequence tag */
    ret = mbedtls_asn1_get_tag(p, end, &len,
                               MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE);
    if (ret != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
    }

    if (*p + len != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    /*
     * Cannot be an empty sequence.
     */
    if (len == 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    while (*p < end) {
        mbedtls_x509_buf policy_oid;
        const unsigned char *policy_end;

        /*
         * Get the policy sequence
         */
        if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                        MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }

        policy_end = *p + len;

        if ((ret = mbedtls_asn1_get_tag(p, policy_end, &len,
                                        MBEDTLS_ASN1_OID)) != 0) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
        }

        policy_oid.tag = MBEDTLS_ASN1_OID;
        policy_oid.len = len;
        policy_oid.p = *p;

        /*
         * Only AnyPolicy is currently supported when enforcing policy.
         */
        if (MBEDTLS_OID_CMP(MBEDTLS_OID_ANY_POLICY, &policy_oid) != 0) {
            /*
             * Set the parsing return code but continue parsing, in case this
             * extension is critical.
             */
            parse_ret = MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE;
        }

        /* Allocate and assign next pointer */
        if (cur->buf.p != NULL) {
            if (cur->next != NULL) {
                return MBEDTLS_ERR_X509_INVALID_EXTENSIONS;
            }

            cur->next = mbedtls_calloc(1, sizeof(mbedtls_asn1_sequence));

            if (cur->next == NULL) {
                return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                         MBEDTLS_ERR_ASN1_ALLOC_FAILED);
            }

            cur = cur->next;
        }

        buf = &(cur->buf);
        buf->tag = policy_oid.tag;
        buf->p = policy_oid.p;
        buf->len = policy_oid.len;

        *p += len;

        /*
         * If there is an optional qualifier, then *p < policy_end
         * Check the Qualifier len to verify it doesn't exceed policy_end.
         */
        if (*p < policy_end) {
            if ((ret = mbedtls_asn1_get_tag(p, policy_end, &len,
                                            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) !=
                0) {
                return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
            }
            /*
             * Skip the optional policy qualifiers.
             */
            *p += len;
        }

        if (*p != policy_end) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                     MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
        }
    }

    /* Set final sequence entry's next pointer to NULL */
    cur->next = NULL;

    if (*p != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    return parse_ret;
}